

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall slang::ast::Compilation::~Compilation(Compilation *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  pointer ppVar3;
  pointer ppDVar4;
  pointer ppCVar5;
  pointer pSVar6;
  RootSymbol *pRVar7;
  
  std::
  vector<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>,_std::allocator<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>_>_>
  ::~vector(&this->subroutineStorage);
  ska::detailv3::
  sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>_>_>
  ::~sherwood_v3_table
            (&(this->defaultDisableMap).
              super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  ::~sherwood_v3_table
            (&(this->globalClockingMap).
              super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  ::~sherwood_v3_table
            (&(this->defaultClockingMap).
              super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
            );
  ppSVar1 = (this->nameConflicts).
            super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->nameConflicts).
                                  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
  }
  ppSVar2 = (this->externInterfaceMethods).
            super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2,(long)(this->externInterfaceMethods).
                                  super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar2
                   );
  }
  ska::detailv3::sherwood_v3_table<$b062436f$>::~sherwood_v3_table
            (&(this->packageExportCandidateMap).super_sherwood_v3_table<_b062436f_>);
  ppVar3 = (this->dpiExports).
           super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar3 != (pointer)0x0) {
    operator_delete(ppVar3,(long)(this->dpiExports).
                                 super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar3);
  }
  ska::detailv3::
  sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
  ::~sherwood_v3_table
            (&(this->paramOverrides).childNodes.
              super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>
  ::~sherwood_v3_table
            ((sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>
              *)&this->paramOverrides);
  ska::detailv3::
  sherwood_v3_table<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::syntax::BindDirectiveSyntax_*,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::BindDirectiveSyntax_*>_>_>
  ::~sherwood_v3_table
            (&(this->seenBindDirectives).
              super_sherwood_v3_table<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::syntax::BindDirectiveSyntax_*,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::BindDirectiveSyntax_*>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>
  ::~sherwood_v3_table
            (&(this->bindDirectivesByDef).
              super_sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  ::~sherwood_v3_table
            (&(this->gateMap).
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  ::~sherwood_v3_table
            (&(this->udpMap).
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
            );
  ppDVar4 = (this->unreferencedDefs).
            super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppDVar4 != (pointer)0x0) {
    operator_delete(ppDVar4,(long)(this->unreferencedDefs).
                                  super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppDVar4
                   );
  }
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::~vector(&this->syntaxTrees);
  ppCVar5 = (this->compilationUnits).
            super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar5 != (pointer)0x0) {
    operator_delete(ppCVar5,(long)(this->compilationUnits).
                                  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar5
                   );
  }
  std::_Optional_payload_base<slang::Diagnostics>::_M_reset
            ((_Optional_payload_base<slang::Diagnostics> *)&this->cachedAllDiagnostics);
  std::_Optional_payload_base<slang::Diagnostics>::_M_reset
            ((_Optional_payload_base<slang::Diagnostics> *)&this->cachedSemanticDiagnostics);
  std::_Optional_payload_base<slang::Diagnostics>::_M_reset
            ((_Optional_payload_base<slang::Diagnostics> *)&this->cachedParseDiagnostics);
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector
            (&(this->tempDiag).notes);
  pSVar6 = (this->tempDiag).ranges.
           super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar6 != (pointer)0x0) {
    operator_delete(pSVar6,(long)(this->tempDiag).ranges.
                                 super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar6);
  }
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  ::~vector(&(this->tempDiag).args);
  pRVar7 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  if (pRVar7 != (RootSymbol *)0x0) {
    operator_delete(pRVar7,0x90);
  }
  (this->root)._M_t.
  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>._M_t.
  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>.
  super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl = (RootSymbol *)0x0;
  ska::detailv3::sherwood_v3_table<$a9d55d12$>::~sherwood_v3_table
            (&(this->outOfBlockDecls).super_sherwood_v3_table<_a9d55d12_>);
  ska::detailv3::
  sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
  ::~sherwood_v3_table
            (&(this->diagMap).
              super_sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
  ::~sherwood_v3_table
            (&(this->definitionMap).
              super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_const_slang::syntax::ModuleDeclarationSyntax_*,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>_>
  ::~sherwood_v3_table
            (&(this->definitionMetadata).
              super_sherwood_v3_table<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_const_slang::syntax::ModuleDeclarationSyntax_*,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~sherwood_v3_table
            (&(this->globalInstantiations).
              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
  ::~sherwood_v3_table
            (&(this->attributeMap).
              super_sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  ::~sherwood_v3_table
            (&(this->methodMap).
              super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  ::~sherwood_v3_table
            (&(this->subroutineMap).
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>
  ::~sherwood_v3_table
            (&(this->packageMap).
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::parsing::TokenKind,_slang::Hasher<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::Hasher<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_std::equal_to<slang::parsing::TokenKind>_>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>_>
  ::~sherwood_v3_table
            (&(this->knownNetTypes).
              super_sherwood_v3_table<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::parsing::TokenKind,_slang::Hasher<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::Hasher<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_std::equal_to<slang::parsing::TokenKind>_>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
  ::~sherwood_v3_table
            (&(this->knownTypes).
              super_sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<unsigned_int,_const_slang::ast::Type_*>,_unsigned_int,_slang::Hasher<unsigned_int>,_ska::detailv3::KeyOrValueHasher<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_slang::Hasher<unsigned_int>_>,_std::equal_to<unsigned_int>,_ska::detailv3::KeyOrValueEquality<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_std::equal_to<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_int,_const_slang::ast::Type_*>_>_>_>
  ::~sherwood_v3_table
            (&(this->vectorTypeCache).
              super_sherwood_v3_table<std::pair<unsigned_int,_const_slang::ast::Type_*>,_unsigned_int,_slang::Hasher<unsigned_int>,_ska::detailv3::KeyOrValueHasher<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_slang::Hasher<unsigned_int>_>,_std::equal_to<unsigned_int>,_ska::detailv3::KeyOrValueEquality<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_std::equal_to<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_int,_const_slang::ast::Type_*>_>_>_>
            );
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>
  ::~sherwood_v3_table
            (&(this->topDefinitions).
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>
            );
  std::
  _Deque_base<slang::ast::Scope::ImportDataIndex,_std::allocator<slang::ast::Scope::ImportDataIndex>_>
  ::~_Deque_base(&(this->importData).freelist.
                  super__Deque_base<slang::ast::Scope::ImportDataIndex,_std::allocator<slang::ast::Scope::ImportDataIndex>_>
                );
  std::
  vector<std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>,_std::allocator<std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>_>
  ::~vector(&(this->importData).storage);
  std::
  _Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ::~_Deque_base(&(this->deferredData).freelist.
                  super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
                );
  std::
  vector<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
  ::~vector(&(this->deferredData).storage);
  TypedBumpAllocator<slang::ast::GenericClassDefSymbol>::~TypedBumpAllocator
            (&this->genericClassAllocator);
  TypedBumpAllocator<slang::ConstantValue>::~TypedBumpAllocator(&this->constantAllocator);
  TypedBumpAllocator<ska::flat_hash_map<unsigned_long,_unsigned_long,_slang::Hasher<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~TypedBumpAllocator(&this->pointerMapAllocator);
  TypedBumpAllocator<ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  ::~TypedBumpAllocator(&this->symbolMapAllocator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->options).paramOverrides);
  ska::detailv3::
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~sherwood_v3_table
            (&(this->options).topModules.
              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            );
  BumpAllocator::~BumpAllocator(&this->super_BumpAllocator);
  return;
}

Assistant:

Compilation::~Compilation() = default;